

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O0

int testEncoding(int param_1,char **param_2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  int ret;
  char *loc;
  char **param_1_local;
  int param_0_local;
  
  pcVar4 = setlocale(6,"");
  if (pcVar4 == (char *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Locale: None");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Locale: ");
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  uVar1 = testHelloWorldEncoding();
  uVar2 = testRobustEncoding();
  uVar3 = testCommandLineArguments();
  return uVar3 | uVar2 | uVar1;
}

Assistant:

int testEncoding(int, char*[])
{
  const char* loc = setlocale(LC_ALL, "");
  if(loc)
    {
    std::cout << "Locale: " << loc << std::endl;
    }
  else
    {
    std::cout << "Locale: None" << std::endl;
    }

  int ret = 0;

  ret |= testHelloWorldEncoding();
  ret |= testRobustEncoding();
  ret |= testCommandLineArguments();

  return ret;
}